

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_dmabuf.cpp
# Opt level: O2

MPP_RET mpp_dmabuf_sync_end(RK_S32 fd,RK_S32 ro,char *caller)

{
  int iVar1;
  int *piVar2;
  char *pcVar3;
  MPP_RET MVar4;
  dma_buf_sync sync;
  
  MVar4 = MPP_OK;
  iVar1 = ioctl(fd,0x40086200);
  if (iVar1 != 0) {
    piVar2 = __errno_location();
    pcVar3 = strerror(*piVar2);
    _mpp_log_l(2,(char *)0x0,"ioctl failed for %s from %s\n","mpp_dmabuf_sync_end",pcVar3,caller);
    MVar4 = MPP_NOK;
  }
  return MVar4;
}

Assistant:

MPP_RET mpp_dmabuf_sync_end(RK_S32 fd, RK_S32 ro, const char *caller)
{
    struct dma_buf_sync sync;
    RK_S32 ret;

    sync.flags = DMA_BUF_SYNC_END | (ro ? DMA_BUF_SYNC_READ : DMA_BUF_SYNC_RW);

    ret = ioctl(fd, DMA_BUF_IOCTL_SYNC, &sync);
    if (ret) {
        mpp_err_f("ioctl failed for %s from %s\n", strerror(errno), caller);
        return MPP_NOK;
    }

    return MPP_OK;
}